

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

socket_t __thiscall
httplib::Server::create_server_socket(Server *this,char *host,int port,int socket_flags)

{
  socket_t sVar1;
  int socket_flags_local;
  int port_local;
  char *host_local;
  Server *this_local;
  
  sVar1 = detail::
          create_socket<httplib::Server::create_server_socket(char_const*,int,int)const::_lambda(int,addrinfo&)_1_>
                    (host,port,socket_flags);
  return sVar1;
}

Assistant:

inline socket_t Server::create_server_socket(const char* host, int port, int socket_flags) const
{
    return detail::create_socket(host, port,
        [](socket_t sock, struct addrinfo& ai) -> bool {
            if (::bind(sock, ai.ai_addr, ai.ai_addrlen)) {
                  return false;
            }
            if (::listen(sock, 5)) { // Listen through 5 channels
                return false;
            }
            return true;
        }, socket_flags);
}